

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O0

void * __thiscall msgpack::v1::zone::allocate_align(zone *this,size_t size,size_t align)

{
  char *ptr_00;
  size_t in_RDX;
  zone *in_RSI;
  long in_RDI;
  char *ptr;
  size_t enough_size;
  size_t adjusted_size;
  char *aligned;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = get_aligned(*(char **)(in_RDI + 0x10),in_RDX);
  local_28 = (long)in_RSI + ((long)local_20 - *(long *)(in_RDI + 0x10));
  if (*(ulong *)(in_RDI + 8) < local_28) {
    ptr_00 = allocate_expand(in_RSI,in_RDX);
    local_20 = get_aligned(ptr_00,in_RDX);
    local_28 = (long)in_RSI + ((long)local_20 - *(long *)(in_RDI + 0x10));
  }
  *(ulong *)(in_RDI + 8) = *(long *)(in_RDI + 8) - local_28;
  *(ulong *)(in_RDI + 0x10) = local_28 + *(long *)(in_RDI + 0x10);
  return local_20;
}

Assistant:

inline void* zone::allocate_align(size_t size, size_t align)
{
    char* aligned = get_aligned(m_chunk_list.m_ptr, align);
    size_t adjusted_size = size + static_cast<size_t>(aligned - m_chunk_list.m_ptr);
    if (m_chunk_list.m_free < adjusted_size) {
        size_t enough_size = size + align - 1;
        char* ptr = allocate_expand(enough_size);
        aligned = get_aligned(ptr, align);
        adjusted_size = size + static_cast<size_t>(aligned - m_chunk_list.m_ptr);
    }
    m_chunk_list.m_free -= adjusted_size;
    m_chunk_list.m_ptr  += adjusted_size;
    return aligned;
}